

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall
QHostInfoLookupManager::lookupFinished(QHostInfoLookupManager *this,QHostInfoRunnable *r)

{
  QMutex *pQVar1;
  __pointer_type pQVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QHostInfoRunnable *local_38;
  QHostInfoRunnable *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->mutex;
  local_38 = r;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_001b164d;
  }
  QBasicMutex::lockInternal();
LAB_001b164d:
  if (this->wasDeleted == false) {
    QtPrivate::sequential_erase_one<QList<QHostInfoRunnable*>,QHostInfoRunnable*>
              (&this->currentLookups,&local_38);
    local_30 = local_38;
    QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
              ((QPodArrayOps<QHostInfoRunnable*> *)&this->finishedLookups,
               (this->finishedLookups).d.size,&local_30);
    QList<QHostInfoRunnable_*>::end(&this->finishedLookups);
    rescheduleWithMutexHeld(this);
  }
  LOCK();
  pQVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoLookupManager::lookupFinished(QHostInfoRunnable *r)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

#if QT_CONFIG(thread)
    currentLookups.removeOne(r);
#endif
    finishedLookups.append(r);
    rescheduleWithMutexHeld();
}